

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O3

bool __thiscall Glucose::reduceDB_lt::operator()(reduceDB_lt *this,CRef x,CRef y)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  puVar1 = (this->ca->super_RegionAllocator<unsigned_int>).memory;
  uVar2 = *(ulong *)(puVar1 + x);
  iVar4 = (int)(uVar2 >> 0x20);
  uVar3 = *(ulong *)(puVar1 + y);
  iVar6 = (int)(uVar3 >> 0x20);
  if (2 < iVar4 && iVar6 == 2) {
    return true;
  }
  if (iVar6 < 3) {
    if (uVar3 >> 0x20 == 2 && uVar2 >> 0x20 == 2) {
      return false;
    }
  }
  else if (iVar4 == 2) {
    return false;
  }
  uVar5 = (uint)(uVar2 >> 0xb) & 0xfffff;
  uVar7 = (uint)(uVar3 >> 0xb) & 0xfffff;
  if (uVar5 <= uVar7) {
    if (uVar5 < uVar7) {
      return false;
    }
    return (float)puVar1[(ulong)x + (uVar2 >> 0x20) + 3] <=
           (float)puVar1[(ulong)y + (uVar3 >> 0x20) + 3] &&
           (float)puVar1[(ulong)y + (uVar3 >> 0x20) + 3] !=
           (float)puVar1[(ulong)x + (uVar2 >> 0x20) + 3];
  }
  return true;
}

Assistant:

bool operator()(CRef x, CRef y) {

        // Main criteria... Like in MiniSat we keep all binary clauses
        if (ca[x].size() > 2 && ca[y].size() == 2) return 1;

        if (ca[y].size() > 2 && ca[x].size() == 2) return 0;
        if (ca[x].size() == 2 && ca[y].size() == 2) return 0;

        // Second one  based on literal block distance
        if (ca[x].lbd() > ca[y].lbd()) return 1;
        if (ca[x].lbd() < ca[y].lbd()) return 0;


        // Finally we can use old activity or size, we choose the last one
        return ca[x].activity() < ca[y].activity();
        //return x->size() < y->size();

        //return ca[x].size() > 2 && (ca[y].size() == 2 || ca[x].activity() < ca[y].activity()); } 
    }